

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O3

bool __thiscall
InliningHeuristics::BackendInlineIntoInliner
          (InliningHeuristics *this,FunctionJITTimeInfo *inlinee,Func *inliner,Func *topFunction,
          ProfileId callSiteId,bool isConstructorCall,bool isFixedMethodCall,
          bool isCallOutsideLoopInTopFunc,bool isCallInsideLoop,uint recursiveInlineDepth,
          uint16 constantArguments)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint uVar7;
  uint uVar8;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  intptr_t iVar11;
  intptr_t iVar12;
  JITTimeProfileInfo *this_00;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  undefined4 *puVar19;
  char16_t *form;
  undefined6 in_register_00000082;
  wchar local_168 [4];
  char16 debugStringBuffer [42];
  wchar local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer3 [42];
  undefined4 uStack_4c;
  
  stack0xffffffffffffffb0 =
       (char16 *)CONCAT44(uStack_4c,(int)CONCAT62(in_register_00000082,callSiteId));
  pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
  uVar4 = JITTimeFunctionBody::GetArgUsedForBranch(pJVar9);
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineRecursivePhase,uVar7,uVar8);
  if (bVar3) {
LAB_0055f57d:
    bVar3 = FunctionJITTimeInfo::IsJsBuiltInForceInline(inlinee);
    if (bVar3) {
      return true;
    }
    uVar7 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar7,uVar8);
    if (!bVar3) {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar7,uVar8);
      if (!bVar3) {
        uVar7 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
        uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar7,uVar8);
        if (!bVar3) {
          debugStringBuffer3._76_4_ = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
          uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01599240,InlineTreePhase,debugStringBuffer3._76_4_,uVar7
                            );
          if (!bVar3) {
            pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
            uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
            pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
            uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineTreePhase,uVar7,uVar8);
            if (!bVar3) {
              uVar7 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
              uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
              bVar3 = Js::Phases::IsEnabled
                                ((Phases *)&DAT_01599240,InlineAtEveryCallerPhase,uVar7,uVar8);
              if (!bVar3) {
                pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
                this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
                if (this_00 != (JITTimeProfileInfo *)0x0) {
                  uVar5 = JITTimeProfileInfo::GetConstantArgInfo(this_00,debugStringBuffer3[0x28]);
                  pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                  uVar6 = JITTimeFunctionBody::GetArgUsedForBranch(pJVar9);
                  if ((uVar6 & uVar5) != 0) {
                    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                    uVar7 = JITTimeFunctionBody::GetNonLoadByteCodeCount(pJVar9);
                    if (uVar7 < (uint)(this->threshold).constantArgumentInlineThreshold)
                    goto LAB_0055f75b;
                  }
                }
                pFVar10 = JITTimeWorkItem::GetJITTimeInfo(topFunction->m_workItem);
                bVar3 = FunctionJITTimeInfo::IsAggressiveInliningEnabled(pFVar10);
                if (!bVar3 && !isConstructorCall) {
                  if (isCallInsideLoop) {
                    bVar3 = IsInlineeLeaf(inlinee);
                    if (bVar3) goto LAB_0055f75b;
                    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                    bVar3 = JITTimeFunctionBody::HasLoops(pJVar9);
                    if (bVar3) {
                      uVar7 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
                      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
                      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar7,uVar8)
                      ;
                      if (bVar3) {
                        pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (inlinee,(wchar (*) [42])local_168);
                        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
                        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                        pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
                        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (pFVar10,(wchar (*) [42])local_108);
                        pJVar9 = FunctionJITTimeInfo::GetBody(this->topFunc);
                        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                        pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (this->topFunc,(wchar (*) [42])local_a8);
                        form = 
                        L"INLINING: Skip Inline (backend): Recursive loop inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"
                        ;
                        goto LAB_0055f835;
                      }
                      goto LAB_0055f845;
                    }
                  }
                  if (!isCallOutsideLoopInTopFunc) {
                    return true;
                  }
                  if (-1 < (this->threshold).outsideLoopInlineThreshold) {
                    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                    uVar7 = JITTimeFunctionBody::GetNonLoadByteCodeCount(pJVar9);
                    if (uVar7 <= (uint)((this->threshold).outsideLoopInlineThreshold <<
                                       ((uVar4 & constantArguments) != 0))) {
                      return true;
                    }
                  }
                  if (isCallInsideLoop) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                    *puVar19 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningHeuristics.cpp"
                                       ,0xb4,"(!isCallInsideLoop)","!isCallInsideLoop");
                    if (!bVar3) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    *puVar19 = 0;
                  }
                  uVar7 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
                  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
                  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar7,uVar8);
                  if (bVar3) {
                    iVar1 = (this->threshold).outsideLoopInlineThreshold;
                    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                    uVar7 = JITTimeFunctionBody::GetByteCodeCount(pJVar9);
                    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
                    register0x00000000 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (inlinee,(wchar (*) [42])local_168);
                    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
                    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
                    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (pFVar10,(wchar (*) [42])local_108);
                    pJVar9 = FunctionJITTimeInfo::GetBody(this->topFunc);
                    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (this->topFunc,(wchar (*) [42])local_a8);
                    Output::Print(L"INLINING: Skip Inline (backend): Inlining outside loop doesn\'t meet OutsideLoopInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"
                                  ,iVar1,uVar7,stack0xffffffffffffffb0,pcVar13,pcVar14,pcVar15,
                                  pcVar16,pcVar17);
                    goto LAB_0055f840;
                  }
                  goto LAB_0055f845;
                }
              }
            }
          }
        }
      }
    }
LAB_0055f75b:
    bVar3 = true;
  }
  else {
    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
    iVar11 = JITTimeFunctionBody::GetAddr(pJVar9);
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
    iVar12 = JITTimeFunctionBody::GetAddr(pJVar9);
    if (iVar11 != iVar12) goto LAB_0055f57d;
    pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
    bVar3 = JITTimeFunctionBody::CanInlineRecursively
                      (pJVar9,recursiveInlineDepth,(uVar4 & constantArguments) != 0);
    if (bVar3) goto LAB_0055f57d;
    uVar7 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar7,uVar8);
    if (bVar3) {
      pJVar9 = FunctionJITTimeInfo::GetBody(inlinee);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_168);
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inliner->m_workItem);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo(inliner->m_workItem);
      pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_108);
      pJVar9 = FunctionJITTimeInfo::GetBody(this->topFunc);
      pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet(this->topFunc,(wchar (*) [42])local_a8);
      form = 
      L"INLINING: Skip Inline (backend): Recursive inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s) Depth: %d\n"
      ;
LAB_0055f835:
      Output::Print(form,pcVar13,pcVar14,pcVar15,pcVar16,pcVar17,pcVar18);
LAB_0055f840:
      Output::Flush();
    }
LAB_0055f845:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool InliningHeuristics::BackendInlineIntoInliner(const FunctionJITTimeInfo * inlinee,
                                Func * inliner,
                                Func *topFunction,
                                Js::ProfileId callSiteId,
                                bool isConstructorCall,
                                bool isFixedMethodCall,                     // Reserved
                                bool isCallOutsideLoopInTopFunc,            // There is a loop for sure and this call is outside loop
                                bool isCallInsideLoop,
                                uint recursiveInlineDepth,
                                uint16 constantArguments
                                )
{
    // We have one piece of additional data in backend, whether  we are outside loop or inside
    // This function decides to inline or not based on that additional data. Most of the filtering is already done by DeciderInlineIntoInliner which is called
    // during work item creation.
    // This is additional filtering during actual inlining phase.

    // Note *order* is important
    // Following are
    // 1. Constructor is always inlined (irrespective of inside or outside)
    // 2. If the inlinee candidate has constant argument and that argument is used for a branch and the inlinee size is within ConstantArgumentInlineThreshold(157) we inline
    // 3. Inside loops:
    //     3a. Leaf function will always get inlined (irrespective of leaf has loop or not)
    //     3b. If the inlinee has loops, don't inline it (Basically avoiding inlining a loop within another loop unless its leaf).
    // 4. Outside loop (inliner has loops):
    //     4a. Only inline small inlinees. Governed by OutsideLoopInlineThreshold (16)
    // 5. Rest are inlined.
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // TODO: OOP JIT, somehow need to track across functions
    bool doBackEndAggressiveInline = (constantArguments & inlinee->GetBody()->GetArgUsedForBranch()) != 0;

    if (!PHASE_OFF(Js::InlineRecursivePhase, inliner)
        && inlinee->GetBody()->GetAddr() == inliner->GetJITFunctionBody()->GetAddr()
        && (!inlinee->GetBody()->CanInlineRecursively(recursiveInlineDepth, doBackEndAggressiveInline)))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Recursive inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s) Depth: %d\n"),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3),
            recursiveInlineDepth);
        return false;
    }

    if(inlinee->IsJsBuiltInForceInline() ||
        PHASE_FORCE(Js::InlinePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlinePhase, inliner) ||
        PHASE_FORCE(Js::InlinePhase, inlinee))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineTreePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlineTreePhase, inliner))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineAtEveryCallerPhase, inlinee))
    {
        return true;
    }

    const JITTimeProfileInfo *dynamicProfile = inliner->GetReadOnlyProfileInfo();

    bool doConstantArgumentInlining = (dynamicProfile && dynamicProfile->GetConstantArgInfo(callSiteId) & inlinee->GetBody()->GetArgUsedForBranch()) != 0;
    if (doConstantArgumentInlining && inlinee->GetBody()->GetNonLoadByteCodeCount() <  (uint)threshold.constantArgumentInlineThreshold)
    {
        return true;
    }


    if (topFunction->GetWorkItem()->GetJITTimeInfo()->IsAggressiveInliningEnabled())
    {
        return true;
    }

    if (isConstructorCall)
    {
        return true;
    }


    if (isCallInsideLoop && IsInlineeLeaf(inlinee))
    {
        return true;
    }

    if (isCallInsideLoop && inlinee->GetBody()->HasLoops() )                            // Don't inline function with loops inside another loop unless it is a leaf
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Recursive loop inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
    byte scale = 1;

    if (doBackEndAggressiveInline)
    {
        scale = 2;
    }

    if (isCallOutsideLoopInTopFunc &&
        (threshold.outsideLoopInlineThreshold < 0 ||
        inlinee->GetBody()->GetNonLoadByteCodeCount() > (uint)threshold.outsideLoopInlineThreshold * scale))
    {
        Assert(!isCallInsideLoop);
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Inlining outside loop doesn't meet OutsideLoopInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"),
            threshold.outsideLoopInlineThreshold,
            inlinee->GetBody()->GetByteCodeCount(),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
    return true;
}